

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::AddNodeToGraph
          (Discreet3DSImporter *this,aiScene *pcSOut,aiNode *pcOut,Node *pcIn,aiMatrix4x4 *param_4)

{
  uint uVar1;
  aiColor4D *paVar2;
  aiMesh **ppaVar3;
  aiMesh *paVar4;
  aiCamera *paVar5;
  aiLight *paVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __type _Var10;
  bool bVar11;
  reference pvVar12;
  size_type sVar13;
  ulong uVar14;
  uint *puVar15;
  aiVector3D *paVar16;
  Logger *pLVar17;
  reference paVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  aiNodeAnim *this_00;
  aiVectorKey *paVar22;
  aiQuatKey *paVar23;
  aiQuaterniont<float> *paVar24;
  long lVar25;
  aiNode **ppaVar26;
  aiNode *paVar27;
  reference ppNVar28;
  float fVar29;
  aiVector3t<float> aVar30;
  aiQuaterniont<float> aVar31;
  aiVectorKey *local_428;
  aiQuatKey *local_3d8;
  aiVectorKey *local_3a8;
  uint local_2f0;
  uint i_2;
  uint size;
  aiQuaternion aStack_2e0;
  aiQuatKey *q_1;
  undefined1 auStack_2c8 [4];
  uint n_2;
  aiQuaternion abs1;
  aiNodeAnim *nda;
  float local_2a8;
  uint local_2a4;
  float fStack_2a0;
  uint n_1;
  float local_298;
  uint local_294;
  undefined1 auStack_290 [4];
  uint n;
  double local_288;
  reference local_280;
  aiFloatKey *f;
  aiQuatKey *q;
  aiAnimation *paStack_268;
  uint i_1;
  aiAnimation *anim;
  aiVector3D *v_1;
  aiVector3D *v;
  aiMatrix4x4 *m;
  aiMatrix4x4t<float> local_220;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> local_1e0;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> local_1d8;
  iterator it;
  string tempStr;
  char tmp [12];
  aiVector3t<float> *local_160;
  aiVector3D *t2;
  aiVector3D *pvCurrent;
  aiVector3D *pvEnd;
  aiMesh *mesh;
  uint iIndex;
  uint i;
  aiVector3D pivot;
  aiMatrix4x4 mInvTransposed;
  aiMatrix4x4 mInv;
  Mesh *imesh;
  Mesh *pcMesh;
  uint a;
  aiMatrix4x4 abs;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> iArray;
  aiMatrix4x4 *param_4_local;
  Node *pcIn_local;
  aiNode *pcOut_local;
  aiScene *pcSOut_local;
  Discreet3DSImporter *this_local;
  
  iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)param_4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,3);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)((long)&pcMesh + 4));
  for (pcMesh._0_4_ = 0; (uint)pcMesh < pcSOut->mNumMeshes; pcMesh._0_4_ = (uint)pcMesh + 1) {
    paVar2 = pcSOut->mMeshes[(uint)pcMesh]->mColors[0];
    if (paVar2 == (aiColor4D *)0x0) {
      __assert_fail("__null != pcMesh",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                    ,0x1cb,
                    "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                   );
    }
    _Var10 = std::operator==(&pcIn->mName,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &paVar2[4].b);
    if (_Var10) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (value_type_conflict3 *)&pcMesh);
    }
  }
  bVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  if (!bVar11) {
    ppaVar3 = pcSOut->mMeshes;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
    paVar2 = ppaVar3[*pvVar12]->mColors[0];
    mInvTransposed.d3 = paVar2[9].b;
    mInvTransposed.d4 = paVar2[9].a;
    pivot.z = paVar2[9].b;
    unique0x10000b2c = paVar2[9].a;
    mInvTransposed.a1 = paVar2[10].r;
    mInvTransposed.a2 = paVar2[10].g;
    mInvTransposed.a3 = paVar2[10].b;
    mInvTransposed.a4 = paVar2[10].a;
    mInvTransposed.b1 = paVar2[0xb].r;
    mInvTransposed.b2 = paVar2[0xb].g;
    mInvTransposed.b3 = paVar2[0xb].b;
    mInvTransposed.b4 = paVar2[0xb].a;
    mInvTransposed.c1 = paVar2[0xc].r;
    mInvTransposed.c2 = paVar2[0xc].g;
    mInvTransposed.c3 = paVar2[0xc].b;
    mInvTransposed.c4 = paVar2[0xc].a;
    mInvTransposed.d1 = paVar2[0xd].r;
    mInvTransposed.d2 = paVar2[0xd].g;
    aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&mInvTransposed.d3);
    aiMatrix4x4t<float>::Transpose((aiMatrix4x4t<float> *)&pivot.z);
    pivot.x = (pcIn->vPivot).z;
    iIndex = (uint)(pcIn->vPivot).x;
    i = (uint)(pcIn->vPivot).y;
    sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    pcOut->mNumMeshes = (uint)sVar13;
    sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sVar13;
    uVar14 = SUB168(auVar8 * ZEXT816(4),0);
    if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    puVar15 = (uint *)operator_new__(uVar14);
    pcOut->mMeshes = puVar15;
    for (mesh._4_4_ = 0;
        sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48),
        mesh._4_4_ < sVar13; mesh._4_4_ = mesh._4_4_ + 1) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                           (ulong)mesh._4_4_);
      uVar1 = *pvVar12;
      paVar4 = pcSOut->mMeshes[uVar1];
      if (paVar4->mColors[1] == (aiColor4D *)0x0) {
        paVar16 = paVar4->mVertices + paVar4->mNumVertices;
        local_160 = paVar4->mNormals;
        for (t2 = paVar4->mVertices; t2 != paVar16; t2 = t2 + 1) {
          aVar30 = ::operator*((aiMatrix4x4t<float> *)&mInvTransposed.d3,t2);
          t2->z = aVar30.z;
          t2->x = (float)(int)aVar30._0_8_;
          t2->y = (float)(int)((ulong)aVar30._0_8_ >> 0x20);
          aVar30 = ::operator*((aiMatrix4x4t<float> *)&pivot.z,local_160);
          local_160->x = (float)(int)aVar30._0_8_;
          local_160->y = (float)(int)((ulong)aVar30._0_8_ >> 0x20);
          local_160->z = aVar30.z;
          local_160 = local_160 + 1;
        }
        fVar29 = aiMatrix4x4t<float>::Determinant((aiMatrix4x4t<float> *)&paVar2[9].b);
        if (fVar29 < 0.0) {
          local_160 = paVar4->mNormals;
          for (t2 = paVar4->mVertices; t2 != paVar16; t2 = t2 + 1) {
            t2->x = t2->x * -1.0;
            local_160->x = local_160->x * -1.0;
            local_160 = local_160 + 1;
          }
          pLVar17 = DefaultLogger::get();
          Logger::info(pLVar17,"3DS: Flipping mesh X-Axis");
        }
        if (((float)iIndex != 0.0) || (NAN((float)iIndex))) {
LAB_00b9fe15:
          for (t2 = paVar4->mVertices; t2 != paVar16; t2 = t2 + 1) {
            aiVector3t<float>::operator-=(t2,(aiVector3t<float> *)&iIndex);
          }
        }
        else if (((float)i != 0.0) || (((NAN((float)i) || (pivot.x != 0.0)) || (NAN(pivot.x)))))
        goto LAB_00b9fe15;
        paVar4->mColors[1] = (aiColor4D *)0x1;
      }
      else {
        paVar4->mColors[1] = (aiColor4D *)0x1;
      }
      pcOut->mMeshes[mesh._4_4_] = uVar1;
    }
  }
  if (pcIn->mInstanceNumber < 2) {
    aiString::Set(&pcOut->mName,&pcIn->mName);
  }
  else {
    ASSIMP_itoa10<12ul>((char (*) [12])((long)&tempStr.field_2 + 0xc),pcIn->mInstanceNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   &pcIn->mName,"_inst_");
    std::__cxx11::string::operator+=((string *)&it,tempStr.field_2._M_local_buf + 0xc);
    aiString::Set(&pcOut->mName,(string *)&it);
    std::__cxx11::string::~string((string *)&it);
  }
  sVar13 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&pcIn->aRotationKeys);
  if (sVar13 == 0) {
    sVar13 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::size
                       (&pcIn->aCameraRollKeys);
    if (sVar13 != 0) {
      pvVar20 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
                operator[](&pcIn->aCameraRollKeys,0);
      aiMatrix4x4t<float>::RotationZ(pvVar20->mValue * -0.017453292,&pcOut->mTransformation);
    }
  }
  else {
    local_1d8._M_current =
         (aiQuatKey *)
         std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::begin(&pcIn->aRotationKeys);
    while( true ) {
      local_1e0._M_current =
           (aiQuatKey *)
           std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::end(&pcIn->aRotationKeys);
      bVar11 = __gnu_cxx::operator!=(&local_1d8,&local_1e0);
      if (!bVar11) break;
      paVar18 = __gnu_cxx::
                __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>
                ::operator*(&local_1d8);
      (paVar18->mValue).w = (paVar18->mValue).w * -1.0;
      __gnu_cxx::__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>
      ::operator++(&local_1d8);
    }
    pvVar19 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[](&pcIn->aRotationKeys,0)
    ;
    aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)((long)&m + 4),&pvVar19->mValue);
    aiMatrix4x4t<float>::aiMatrix4x4t(&local_220,(aiMatrix3x3t<float> *)((long)&m + 4));
    memcpy(&pcOut->mTransformation,&local_220,0x40);
  }
  v = (aiVector3D *)&pcOut->mTransformation;
  sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aScalingKeys);
  if (sVar13 != 0) {
    pvVar21 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                        (&pcIn->aScalingKeys,0);
    v_1 = &pvVar21->mValue;
    v->x = v_1->x * v->x;
    v[1].y = v_1->x * v[1].y;
    v[2].z = v_1->x * v[2].z;
    v->y = (pvVar21->mValue).y * v->y;
    v[1].z = (pvVar21->mValue).y * v[1].z;
    v[3].x = (pvVar21->mValue).y * v[3].x;
    v->z = (pvVar21->mValue).z * v->z;
    v[2].x = (pvVar21->mValue).z * v[2].x;
    v[3].y = (pvVar21->mValue).z * v[3].y;
  }
  sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aPositionKeys);
  if (sVar13 != 0) {
    pvVar21 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                        (&pcIn->aPositionKeys,0);
    anim = (aiAnimation *)&pvVar21->mValue;
    v[1].x = ((aiVector3D *)anim)->x + v[1].x;
    v[2].y = (pvVar21->mValue).y + v[2].y;
    v[3].z = (pvVar21->mValue).z + v[3].z;
  }
  sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aPositionKeys);
  if (((1 < sVar13) ||
      (sVar13 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&pcIn->aRotationKeys),
      1 < sVar13)) ||
     ((sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aScalingKeys),
      1 < sVar13 ||
      ((sVar13 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
                 size(&pcIn->aCameraRollKeys), 1 < sVar13 ||
       (sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                           (&pcIn->aTargetPositionKeys), 1 < sVar13)))))) {
    paStack_268 = *pcSOut->mAnimations;
    if (paStack_268 == (aiAnimation *)0x0) {
      __assert_fail("nullptr != anim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                    ,0x242,
                    "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                   );
    }
    sVar13 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::size
                       (&pcIn->aCameraRollKeys);
    if (1 < sVar13) {
      pLVar17 = DefaultLogger::get();
      Logger::debug(pLVar17,"3DS: Converting camera roll track ...");
      sVar13 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
               size(&pcIn->aCameraRollKeys);
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::resize(&pcIn->aRotationKeys,sVar13);
      for (q._4_4_ = 0; uVar14 = (ulong)q._4_4_,
          sVar13 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                   ::size(&pcIn->aCameraRollKeys), uVar14 < sVar13; q._4_4_ = q._4_4_ + 1) {
        f = (aiFloatKey *)
            std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[]
                      (&pcIn->aRotationKeys,(ulong)q._4_4_);
        local_280 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                    ::operator[](&pcIn->aCameraRollKeys,(ulong)q._4_4_);
        f->mTime = local_280->mTime;
        aiQuaterniont<float>::aiQuaterniont
                  ((aiQuaterniont<float> *)auStack_290,0.0,0.0,local_280->mValue * 0.017453292);
        f->mValue = (ai_real)auStack_290;
        *(uint *)&f->field_0xc = n;
        f[1].mTime = local_288;
      }
    }
    for (local_294 = 0; local_294 < pcSOut->mNumCameras; local_294 = local_294 + 1) {
      bVar11 = aiString::operator==(&pcSOut->mCameras[local_294]->mName,&pcOut->mName);
      if (bVar11) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&stack0xfffffffffffffd60,0.0,0.0,1.0);
        paVar5 = pcSOut->mCameras[local_294];
        (paVar5->mLookAt).x = fStack_2a0;
        (paVar5->mLookAt).y = (float)n_1;
        (paVar5->mLookAt).z = local_298;
      }
    }
    for (local_2a4 = 0; local_2a4 < pcSOut->mNumLights; local_2a4 = local_2a4 + 1) {
      bVar11 = aiString::operator==(&pcSOut->mLights[local_2a4]->mName,&pcOut->mName);
      if (bVar11) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&nda,0.0,0.0,1.0);
        paVar6 = pcSOut->mLights[local_2a4];
        *(aiNodeAnim **)&paVar6->mDirection = nda;
        (paVar6->mDirection).z = local_2a8;
      }
    }
    this_00 = (aiNodeAnim *)operator_new(0x438);
    aiNodeAnim::aiNodeAnim(this_00);
    uVar1 = paStack_268->mNumChannels;
    paStack_268->mNumChannels = uVar1 + 1;
    paStack_268->mChannels[uVar1] = this_00;
    abs1._8_8_ = this_00;
    aiString::Set((aiString *)this_00,&pcIn->mName);
    sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aPositionKeys);
    if (sVar13 != 0) {
      sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aPositionKeys);
      *(int *)(abs1._8_8_ + 0x404) = (int)sVar13;
      uVar14 = (ulong)*(uint *)(abs1._8_8_ + 0x404);
      paVar22 = (aiVectorKey *)operator_new__(uVar14 * 0x18);
      if (uVar14 != 0) {
        local_3a8 = paVar22;
        do {
          aiVectorKey::aiVectorKey(local_3a8);
          local_3a8 = local_3a8 + 1;
        } while (local_3a8 != paVar22 + uVar14);
      }
      *(aiVectorKey **)(abs1._8_8_ + 0x408) = paVar22;
      pvVar7 = *(void **)(abs1._8_8_ + 0x408);
      pvVar21 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                          (&pcIn->aPositionKeys,0);
      memcpy(pvVar7,pvVar21,(ulong)*(uint *)(abs1._8_8_ + 0x404) * 0x18);
    }
    sVar13 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&pcIn->aRotationKeys);
    if (sVar13 != 0) {
      sVar13 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&pcIn->aRotationKeys);
      *(int *)(abs1._8_8_ + 0x410) = (int)sVar13;
      uVar14 = (ulong)*(uint *)(abs1._8_8_ + 0x410);
      paVar23 = (aiQuatKey *)operator_new__(uVar14 * 0x18);
      if (uVar14 != 0) {
        local_3d8 = paVar23;
        do {
          aiQuatKey::aiQuatKey(local_3d8);
          local_3d8 = local_3d8 + 1;
        } while (local_3d8 != paVar23 + uVar14);
      }
      *(aiQuatKey **)(abs1._8_8_ + 0x418) = paVar23;
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)auStack_2c8);
      for (q_1._4_4_ = 0; q_1._4_4_ < *(uint *)(abs1._8_8_ + 0x410); q_1._4_4_ = q_1._4_4_ + 1) {
        pvVar19 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[]
                            (&pcIn->aRotationKeys,(ulong)q_1._4_4_);
        if (q_1._4_4_ == 0) {
          i_2 = (uint)(pvVar19->mValue).w;
          size = (uint)(pvVar19->mValue).x;
          aStack_2e0.w = (pvVar19->mValue).y;
          aStack_2e0.x = (pvVar19->mValue).z;
        }
        else {
          aVar31 = aiQuaterniont<float>::operator*
                             ((aiQuaterniont<float> *)auStack_2c8,&pvVar19->mValue);
          aStack_2e0._0_8_ = aVar31._8_8_;
          _i_2 = aVar31._0_8_;
        }
        auStack_2c8 = (undefined1  [4])i_2;
        n_2 = size;
        abs1.w = aStack_2e0.w;
        abs1.x = aStack_2e0.x;
        *(double *)(*(long *)(abs1._8_8_ + 0x418) + (ulong)q_1._4_4_ * 0x18) = pvVar19->mTime;
        paVar24 = aiQuaterniont<float>::Normalize((aiQuaterniont<float> *)auStack_2c8);
        lVar25 = *(long *)(abs1._8_8_ + 0x418) + (ulong)q_1._4_4_ * 0x18;
        *(undefined8 *)(lVar25 + 8) = *(undefined8 *)paVar24;
        *(undefined8 *)(lVar25 + 0x10) = *(undefined8 *)&paVar24->y;
      }
    }
    sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aScalingKeys);
    if (sVar13 != 0) {
      sVar13 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pcIn->aScalingKeys);
      *(int *)(abs1._8_8_ + 0x420) = (int)sVar13;
      uVar14 = (ulong)*(uint *)(abs1._8_8_ + 0x420);
      paVar22 = (aiVectorKey *)operator_new__(uVar14 * 0x18);
      if (uVar14 != 0) {
        local_428 = paVar22;
        do {
          aiVectorKey::aiVectorKey(local_428);
          local_428 = local_428 + 1;
        } while (local_428 != paVar22 + uVar14);
      }
      *(aiVectorKey **)(abs1._8_8_ + 0x428) = paVar22;
      pvVar7 = *(void **)(abs1._8_8_ + 0x428);
      pvVar21 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                          (&pcIn->aScalingKeys,0);
      memcpy(pvVar7,pvVar21,(ulong)*(uint *)(abs1._8_8_ + 0x420) * 0x18);
    }
  }
  sVar13 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::size
                     (&pcIn->mChildren);
  pcOut->mNumChildren = (uint)sVar13;
  sVar13 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::size
                     (&pcIn->mChildren);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = sVar13;
  uVar14 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  ppaVar26 = (aiNode **)operator_new__(uVar14);
  pcOut->mChildren = ppaVar26;
  sVar13 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::size
                     (&pcIn->mChildren);
  for (local_2f0 = 0; local_2f0 < (uint)sVar13; local_2f0 = local_2f0 + 1) {
    paVar27 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar27);
    pcOut->mChildren[local_2f0] = paVar27;
    pcOut->mChildren[local_2f0]->mParent = pcOut;
    paVar27 = pcOut->mChildren[local_2f0];
    ppNVar28 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::operator[]
                         (&pcIn->mChildren,(ulong)local_2f0);
    AddNodeToGraph(this,pcSOut,paVar27,*ppNVar28,(aiMatrix4x4 *)((long)&pcMesh + 4));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void Discreet3DSImporter::AddNodeToGraph(aiScene* pcSOut,aiNode* pcOut,
    D3DS::Node* pcIn, aiMatrix4x4& /*absTrafo*/)
{
    std::vector<unsigned int> iArray;
    iArray.reserve(3);

    aiMatrix4x4 abs;

    // Find all meshes with the same name as the node
    for (unsigned int a = 0; a < pcSOut->mNumMeshes;++a)
    {
        const D3DS::Mesh* pcMesh = (const D3DS::Mesh*)pcSOut->mMeshes[a]->mColors[0];
        ai_assert(NULL != pcMesh);

        if (pcIn->mName == pcMesh->mName)
            iArray.push_back(a);
    }
    if (!iArray.empty())
    {
        // The matrix should be identical for all meshes with the
        // same name. It HAS to be identical for all meshes .....
        D3DS::Mesh* imesh = ((D3DS::Mesh*)pcSOut->mMeshes[iArray[0]]->mColors[0]);

        // Compute the inverse of the transformation matrix to move the
        // vertices back to their relative and local space
        aiMatrix4x4 mInv = imesh->mMat, mInvTransposed = imesh->mMat;
        mInv.Inverse();mInvTransposed.Transpose();
        aiVector3D pivot = pcIn->vPivot;

        pcOut->mNumMeshes = (unsigned int)iArray.size();
        pcOut->mMeshes = new unsigned int[iArray.size()];
        for (unsigned int i = 0;i < iArray.size();++i)  {
            const unsigned int iIndex = iArray[i];
            aiMesh* const mesh = pcSOut->mMeshes[iIndex];

            if (mesh->mColors[1] == NULL)
            {
                // Transform the vertices back into their local space
                // fixme: consider computing normals after this, so we don't need to transform them
                const aiVector3D* const pvEnd = mesh->mVertices + mesh->mNumVertices;
                aiVector3D* pvCurrent = mesh->mVertices, *t2 = mesh->mNormals;

                for (; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                    *pvCurrent = mInv * (*pvCurrent);
                    *t2 = mInvTransposed * (*t2);
                }

                // Handle negative transformation matrix determinant -> invert vertex x
                if (imesh->mMat.Determinant() < 0.0f)
                {
                    /* we *must* have normals */
                    for (pvCurrent = mesh->mVertices, t2 = mesh->mNormals; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                        pvCurrent->x *= -1.f;
                        t2->x *= -1.f;
                    }
                    ASSIMP_LOG_INFO("3DS: Flipping mesh X-Axis");
                }

                // Handle pivot point
                if (pivot.x || pivot.y || pivot.z)
                {
                    for (pvCurrent = mesh->mVertices; pvCurrent != pvEnd; ++pvCurrent)  {
                        *pvCurrent -= pivot;
                    }
                }

                mesh->mColors[1] = (aiColor4D*)1;
            }
            else
                mesh->mColors[1] = (aiColor4D*)1;

            // Setup the mesh index
            pcOut->mMeshes[i] = iIndex;
        }
    }

    // Setup the name of the node
    // First instance keeps its name otherwise something might break, all others will be postfixed with their instance number
    if (pcIn->mInstanceNumber > 1)
    {
        char tmp[12];
        ASSIMP_itoa10(tmp, pcIn->mInstanceNumber);
        std::string tempStr = pcIn->mName + "_inst_";
        tempStr += tmp;
        pcOut->mName.Set(tempStr);
    }
    else
        pcOut->mName.Set(pcIn->mName);

    // Now build the transformation matrix of the node
    // ROTATION
    if (pcIn->aRotationKeys.size()){

        // FIX to get to Assimp's quaternion conventions
        for (std::vector<aiQuatKey>::iterator it = pcIn->aRotationKeys.begin(); it != pcIn->aRotationKeys.end(); ++it) {
            (*it).mValue.w *= -1.f;
        }

        pcOut->mTransformation = aiMatrix4x4( pcIn->aRotationKeys[0].mValue.GetMatrix() );
    }
    else if (pcIn->aCameraRollKeys.size())
    {
        aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(- pcIn->aCameraRollKeys[0].mValue),
            pcOut->mTransformation);
    }

    // SCALING
    aiMatrix4x4& m = pcOut->mTransformation;
    if (pcIn->aScalingKeys.size())
    {
        const aiVector3D& v = pcIn->aScalingKeys[0].mValue;
        m.a1 *= v.x; m.b1 *= v.x; m.c1 *= v.x;
        m.a2 *= v.y; m.b2 *= v.y; m.c2 *= v.y;
        m.a3 *= v.z; m.b3 *= v.z; m.c3 *= v.z;
    }

    // TRANSLATION
    if (pcIn->aPositionKeys.size())
    {
        const aiVector3D& v = pcIn->aPositionKeys[0].mValue;
        m.a4 += v.x;
        m.b4 += v.y;
        m.c4 += v.z;
    }

    // Generate animation channels for the node
    if (pcIn->aPositionKeys.size()  > 1  || pcIn->aRotationKeys.size()   > 1 ||
        pcIn->aScalingKeys.size()   > 1  || pcIn->aCameraRollKeys.size() > 1 ||
        pcIn->aTargetPositionKeys.size() > 1)
    {
        aiAnimation* anim = pcSOut->mAnimations[0];
        ai_assert(nullptr != anim);

        if (pcIn->aCameraRollKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting camera roll track ...");

            // Camera roll keys - in fact they're just rotations
            // around the camera's z axis. The angles are given
            // in degrees (and they're clockwise).
            pcIn->aRotationKeys.resize(pcIn->aCameraRollKeys.size());
            for (unsigned int i = 0; i < pcIn->aCameraRollKeys.size();++i)
            {
                aiQuatKey&  q = pcIn->aRotationKeys[i];
                aiFloatKey& f = pcIn->aCameraRollKeys[i];

                q.mTime  = f.mTime;

                // FIX to get to Assimp quaternion conventions
                q.mValue = aiQuaternion(0.f,0.f,AI_DEG_TO_RAD( /*-*/ f.mValue));
            }
        }
#if 0
        if (pcIn->aTargetPositionKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting target track ...");

            // Camera or spot light - need to convert the separate
            // target position channel to our representation
            TargetAnimationHelper helper;

            if (pcIn->aPositionKeys.empty())
            {
                // We can just pass zero here ...
                helper.SetFixedMainAnimationChannel(aiVector3D());
            }
            else  helper.SetMainAnimationChannel(&pcIn->aPositionKeys);
            helper.SetTargetAnimationChannel(&pcIn->aTargetPositionKeys);

            // Do the conversion
            std::vector<aiVectorKey> distanceTrack;
            helper.Process(&distanceTrack);

            // Now add a new node as child, name it <ourName>.Target
            // and assign the distance track to it. This is that the
            // information where the target is and how it moves is
            // not lost
            D3DS::Node* nd = new D3DS::Node();
            pcIn->push_back(nd);

            nd->mName = pcIn->mName + ".Target";

            aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nda->mNodeName.Set(nd->mName);

            nda->mNumPositionKeys = (unsigned int)distanceTrack.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&distanceTrack[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }
#endif

        // Cameras or lights define their transformation in their parent node and in the
        // corresponding light or camera chunks. However, we read and process the latter
        // to to be able to return valid cameras/lights even if no scenegraph is given.
        for (unsigned int n = 0; n < pcSOut->mNumCameras;++n)   {
            if (pcSOut->mCameras[n]->mName == pcOut->mName) {
                pcSOut->mCameras[n]->mLookAt = aiVector3D(0.f,0.f,1.f);
            }
        }
        for (unsigned int n = 0; n < pcSOut->mNumLights;++n)    {
            if (pcSOut->mLights[n]->mName == pcOut->mName) {
                pcSOut->mLights[n]->mDirection = aiVector3D(0.f,0.f,1.f);
            }
        }

        // Allocate a new node anim and setup its name
        aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
        nda->mNodeName.Set(pcIn->mName);

        // POSITION keys
        if (pcIn->aPositionKeys.size()  > 0)
        {
            nda->mNumPositionKeys = (unsigned int)pcIn->aPositionKeys.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&pcIn->aPositionKeys[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }

        // ROTATION keys
        if (pcIn->aRotationKeys.size()  > 0)
        {
            nda->mNumRotationKeys = (unsigned int)pcIn->aRotationKeys.size();
            nda->mRotationKeys = new aiQuatKey[nda->mNumRotationKeys];

            // Rotations are quaternion offsets
            aiQuaternion abs1;
            for (unsigned int n = 0; n < nda->mNumRotationKeys;++n)
            {
                const aiQuatKey& q = pcIn->aRotationKeys[n];

                abs1 = (n ? abs1 * q.mValue : q.mValue);
                nda->mRotationKeys[n].mTime  = q.mTime;
                nda->mRotationKeys[n].mValue = abs1.Normalize();
            }
        }

        // SCALING keys
        if (pcIn->aScalingKeys.size()  > 0)
        {
            nda->mNumScalingKeys = (unsigned int)pcIn->aScalingKeys.size();
            nda->mScalingKeys = new aiVectorKey[nda->mNumScalingKeys];
            ::memcpy(nda->mScalingKeys,&pcIn->aScalingKeys[0],
                sizeof(aiVectorKey)*nda->mNumScalingKeys);
        }
    }

    // Allocate storage for children
    pcOut->mNumChildren = (unsigned int)pcIn->mChildren.size();
    pcOut->mChildren = new aiNode*[pcIn->mChildren.size()];

    // Recursively process all children
    const unsigned int size = static_cast<unsigned int>(pcIn->mChildren.size());
    for (unsigned int i = 0; i < size;++i)
    {
        pcOut->mChildren[i] = new aiNode();
        pcOut->mChildren[i]->mParent = pcOut;
        AddNodeToGraph(pcSOut,pcOut->mChildren[i],pcIn->mChildren[i],abs);
    }
}